

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O1

void XUtf8DrawString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                    char *string,int num_bytes)

{
  XFontStruct **ppXVar1;
  uint ucs_00;
  Display *pDVar2;
  GC p_Var3;
  unsigned_short uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  char glyph [2];
  uint ucs;
  XChar2b buf [128];
  int local_1c0;
  undefined2 local_1ba;
  XFontStruct **local_1b8;
  ulong local_1b0;
  int local_1a4;
  uint local_1a0;
  uint local_19c;
  ulong local_198;
  Display *local_190;
  Drawable local_188;
  GC local_180;
  ulong local_178;
  long local_170;
  int local_168;
  int local_164;
  int *local_160;
  uchar *local_158;
  int *local_150;
  ulong local_148;
  int *local_140;
  undefined2 local_138 [132];
  
  local_1b0 = (ulong)font_set->nb_font;
  if (0 < (long)local_1b0) {
    local_160 = font_set->encodings;
    ppXVar1 = font_set->fonts;
    if (*ppXVar1 == (XFontStruct *)0x0) {
      uVar7 = 0;
      do {
        if (local_1b0 - 1 == uVar7) {
          return;
        }
        uVar8 = uVar7 + 1;
        lVar10 = uVar7 + 1;
        uVar7 = uVar8;
      } while (ppXVar1[lVar10] == (XFontStruct *)0x0);
      bVar12 = uVar8 < local_1b0;
    }
    else {
      bVar12 = true;
      uVar8 = 0;
    }
    if (bVar12) {
      uVar7 = uVar8;
      local_1b8 = ppXVar1;
      local_1a4 = y;
      local_190 = display;
      local_188 = d;
      local_180 = gc;
      if (num_bytes < 1) {
        uVar11 = 0;
      }
      else {
        local_158 = (uchar *)string;
        local_148 = uVar8 & 0xffffffff;
        local_140 = local_160 + uVar8;
        local_150 = font_set->ranges + uVar8 * 2 + 1;
        lVar10 = uVar8 - local_1b0;
        uVar11 = 0;
        local_1c0 = x;
        local_198 = uVar8;
        do {
          p_Var3 = local_180;
          pDVar2 = local_190;
          local_168 = (int)uVar7;
          local_170 = (long)local_168;
          if (0x78 < (int)uVar11) {
            XSetFont(local_190,local_180,local_1b8[local_170]->fid);
            XDrawString16(pDVar2,local_188,p_Var3,local_1c0,local_1a4,local_138,(int)uVar11);
            iVar5 = XTextWidth16(local_1b8[local_170],local_138,uVar11);
            local_1c0 = local_1c0 + iVar5;
            local_178 = 0;
            uVar11 = local_178;
          }
          local_178 = uVar11;
          local_164 = num_bytes;
          local_1a0 = XFastConvertUtf8ToUcs(local_158,num_bytes,&local_19c);
          if ((int)local_1a0 < 2) {
            local_1a0 = 1;
          }
          uVar4 = XUtf8IsNonSpacing(local_19c);
          if (uVar4 != 0) {
            local_19c = (uint)uVar4;
          }
          ucs_00 = local_19c;
          uVar7 = local_198 & 0xffffffff;
          iVar5 = (int)local_1b0;
          if ((int)local_198 < iVar5) {
            lVar9 = 0;
            do {
              if (ppXVar1[uVar8 + lVar9] != (XFontStruct *)0x0) {
                iVar5 = local_140[lVar9];
                iVar6 = ucs2fontmap((char *)&local_1ba,ucs_00,iVar5);
                if ((-1 < iVar6) &&
                   ((iVar5 != 0 ||
                    ((local_150[lVar9 * 2 + -1] <= (int)ucs_00 &&
                     ((int)ucs_00 <= local_150[lVar9 * 2])))))) {
                  uVar7 = (ulong)(uint)((int)lVar9 + (int)local_198);
                  iVar5 = (int)local_1b0;
                  goto LAB_001fd0da;
                }
              }
              lVar9 = lVar9 + 1;
            } while (lVar10 + lVar9 != 0);
            iVar5 = (int)local_1b0;
            uVar7 = local_1b0 & 0xffffffff;
          }
LAB_001fd0da:
          if ((int)uVar7 == iVar5) {
            ucs2fontmap((char *)&local_1ba,0x3f,local_160[local_148]);
            uVar7 = local_198;
          }
          p_Var3 = local_180;
          pDVar2 = local_190;
          if ((uVar4 == 0) && (local_168 == (int)uVar7)) {
            local_138[(int)local_178] = local_1ba;
            uVar11 = (ulong)((int)local_178 + 1);
          }
          else {
            XSetFont(local_190,local_180,local_1b8[local_170]->fid);
            uVar11 = local_178;
            XDrawString16(pDVar2,local_188,p_Var3,local_1c0,local_1a4,local_138,(int)local_178);
            iVar5 = XTextWidth16(local_1b8[local_170],local_138,uVar11 & 0xffffffff);
            local_1c0 = iVar5 + local_1c0;
            local_138[0] = local_1ba;
            if (uVar4 == 0) {
              uVar11 = 1;
            }
            else {
              iVar5 = XTextWidth16(local_1b8[(int)uVar7],local_138,1);
              uVar11 = 1;
              local_1c0 = local_1c0 - iVar5;
            }
          }
          local_158 = local_158 + local_1a0;
          num_bytes = local_164 - local_1a0;
          x = local_1c0;
        } while (num_bytes != 0 && (int)local_1a0 <= local_164);
      }
      p_Var3 = local_180;
      pDVar2 = local_190;
      XSetFont(local_190,local_180,local_1b8[(int)uVar7]->fid);
      XDrawString16(pDVar2,local_188,p_Var3,x,local_1a4,local_138,(int)uVar11);
    }
  }
  return;
}

Assistant:

void
XUtf8DrawString(Display 	*display,
	        Drawable 	d,
                XUtf8FontStruct *font_set,
	        GC 		gc,
	        int 		x,
	        int 		y,
	        const char	*string,
                int 		num_bytes) {

  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  XDrawString16(display, d, gc, x, y, buf, i);
}